

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O3

void duckdb::BitStringFunction<false>(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  int iVar3;
  unsigned_long *puVar4;
  anon_union_16_2_67f50693_for_value *paVar5;
  int *piVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  reference vector;
  reference vector_00;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  idx_t iVar17;
  long lVar18;
  idx_t iVar19;
  ulong uVar20;
  ValidityMask *in_R8;
  idx_t in_R9;
  idx_t idx_in_entry;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  data_ptr_t pdVar25;
  data_ptr_t pdVar26;
  data_ptr_t pdVar27;
  idx_t count;
  anon_struct_16_3_d7536bce_for_pointer aVar28;
  string_t sVar29;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  UnifiedVectorFormat ldata;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar5 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      aVar28 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          *(int *)vector_00->data,in_R8,in_R9);
      paVar5->pointer = aVar28;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      piVar6 = (int *)vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar25 = vector->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar26 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          iVar3 = *piVar6;
          lVar18 = 8;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + lVar18);
            left_02.value._0_8_ = *(undefined8 *)(pdVar25 + lVar18 + -8);
            sVar29 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,iVar3,in_R8,in_R9);
            *(long *)(pdVar26 + lVar18 + -8) = sVar29.value._0_8_;
            *(long *)(pdVar26 + lVar18) = sVar29.value._8_8_;
            lVar18 = lVar18 + 0x10;
            count = count - 1;
          } while (count != 0);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar20 = 0;
        uVar22 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar14 = uVar22 + 0x40;
            if (count <= uVar22 + 0x40) {
              uVar14 = count;
            }
LAB_01ac050f:
            uVar12 = uVar22;
            if (uVar22 < uVar14) {
              iVar3 = *piVar6;
              uVar24 = uVar22 << 4 | 8;
              do {
                left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar24);
                left_00.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar24 - 8));
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_00,iVar3,in_R8,in_R9);
                *(long *)(pdVar26 + (uVar24 - 8)) = sVar29.value._0_8_;
                *(long *)(pdVar26 + uVar24) = sVar29.value._8_8_;
                uVar22 = uVar22 + 1;
                uVar24 = uVar24 + 0x10;
                uVar12 = uVar14;
              } while (uVar14 != uVar22);
            }
          }
          else {
            uVar24 = puVar4[uVar20];
            uVar14 = uVar22 + 0x40;
            if (count <= uVar22 + 0x40) {
              uVar14 = count;
            }
            uVar12 = uVar14;
            if (uVar24 != 0) {
              if (uVar24 == 0xffffffffffffffff) goto LAB_01ac050f;
              uVar12 = uVar22;
              if (uVar22 < uVar14) {
                uVar21 = uVar22 << 4 | 8;
                uVar23 = 0;
                do {
                  if ((uVar24 >> (uVar23 & 0x3f) & 1) != 0) {
                    left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar21);
                    left.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar21 - 8));
                    sVar29 = BinaryLambdaWrapper::
                             Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left,*piVar6,in_R8,in_R9);
                    *(long *)(pdVar26 + (uVar21 - 8)) = sVar29.value._0_8_;
                    *(long *)(pdVar26 + uVar21) = sVar29.value._8_8_;
                  }
                  uVar23 = uVar23 + 1;
                  uVar21 = uVar21 + 0x10;
                  uVar12 = uVar14;
                } while (uVar14 - uVar22 != uVar23);
              }
            }
          }
          uVar20 = uVar20 + 1;
          uVar22 = uVar12;
          if (uVar20 == count + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar25 = vector->data;
          pdVar26 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar27 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              lVar18 = 0;
              do {
                sVar29.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + lVar18 * 4 + 8);
                sVar29.value._0_8_ = *(undefined8 *)(pdVar25 + lVar18 * 4);
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,sVar29,
                                    *(int *)(pdVar26 + lVar18),in_R8,in_R9);
                *(long *)(pdVar27 + lVar18 * 4) = sVar29.value._0_8_;
                *(long *)(pdVar27 + lVar18 * 4 + 8) = sVar29.value._8_8_;
                lVar18 = lVar18 + 4;
                count = count - 1;
              } while (count != 0);
            }
          }
          else if (0x3f < count + 0x3f) {
            uVar20 = 0;
            uVar22 = 0;
            do {
              puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                uVar14 = uVar22 + 0x40;
                if (count <= uVar22 + 0x40) {
                  uVar14 = count;
                }
LAB_01ac09e0:
                uVar12 = uVar22;
                if (uVar22 < uVar14) {
                  uVar24 = uVar22 << 4 | 8;
                  do {
                    left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar24);
                    left_03.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar24 - 8));
                    sVar29 = BinaryLambdaWrapper::
                             Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left_03,
                                        *(int *)(pdVar26 + uVar22 * 4),in_R8,in_R9);
                    *(long *)(pdVar27 + (uVar24 - 8)) = sVar29.value._0_8_;
                    *(long *)(pdVar27 + uVar24) = sVar29.value._8_8_;
                    uVar22 = uVar22 + 1;
                    uVar24 = uVar24 + 0x10;
                    uVar12 = uVar14;
                  } while (uVar14 != uVar22);
                }
              }
              else {
                uVar24 = puVar4[uVar20];
                uVar14 = uVar22 + 0x40;
                if (count <= uVar22 + 0x40) {
                  uVar14 = count;
                }
                uVar12 = uVar14;
                if (uVar24 != 0) {
                  if (uVar24 == 0xffffffffffffffff) goto LAB_01ac09e0;
                  uVar12 = uVar22;
                  if (uVar22 < uVar14) {
                    uVar21 = uVar22 << 4 | 8;
                    uVar23 = 0;
                    do {
                      if ((uVar24 >> (uVar23 & 0x3f) & 1) != 0) {
                        left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar25 + uVar21);
                        left_04.value._0_8_ = *(undefined8 *)(pdVar25 + (uVar21 - 8));
                        sVar29 = BinaryLambdaWrapper::
                                 Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                           ((anon_class_8_1_6971b95b)result,left_04,
                                            *(int *)(pdVar26 + uVar23 * 4 + uVar22 * 4),in_R8,in_R9)
                        ;
                        *(long *)(pdVar27 + (uVar21 - 8)) = sVar29.value._0_8_;
                        *(long *)(pdVar27 + uVar21) = sVar29.value._8_8_;
                      }
                      uVar23 = uVar23 + 1;
                      uVar21 = uVar21 + 0x10;
                      uVar12 = uVar14;
                    } while (uVar14 - uVar22 != uVar23);
                  }
                }
              }
              uVar20 = uVar20 + 1;
              uVar22 = uVar12;
            } while (uVar20 != count + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&local_78);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar25 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              psVar7 = (local_78.sel)->sel_vector;
              psVar8 = (local_c0.sel)->sel_vector;
              pdVar25 = pdVar25 + 8;
              iVar19 = 0;
              do {
                iVar13 = iVar19;
                if (psVar7 != (sel_t *)0x0) {
                  iVar13 = (idx_t)psVar7[iVar19];
                }
                iVar17 = iVar19;
                if (psVar8 != (sel_t *)0x0) {
                  iVar17 = (idx_t)psVar8[iVar19];
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + iVar13 * 0x10 + 8);
                left_01.value._0_8_ = *(undefined8 *)(local_78.data + iVar13 * 0x10);
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_01,
                                    *(int *)(local_c0.data + iVar17 * 4),in_R8,in_R9);
                *(long *)(pdVar25 + -8) = sVar29.value._0_8_;
                *(long *)pdVar25 = sVar29.value._8_8_;
                iVar19 = iVar19 + 1;
                pdVar25 = pdVar25 + 0x10;
              } while (count != iVar19);
            }
          }
          else if (count != 0) {
            psVar7 = (local_78.sel)->sel_vector;
            psVar8 = (local_c0.sel)->sel_vector;
            pdVar25 = pdVar25 + 8;
            uVar22 = 0;
            do {
              uVar20 = uVar22;
              if (psVar7 != (sel_t *)0x0) {
                uVar20 = (ulong)psVar7[uVar22];
              }
              uVar14 = uVar22;
              if (psVar8 != (sel_t *)0x0) {
                uVar14 = (ulong)psVar8[uVar22];
              }
              if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + uVar20 * 0x10 + 8);
                left_05.value._0_8_ = *(undefined8 *)(local_78.data + uVar20 * 0x10);
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,
                                    *(int *)(local_c0.data + uVar14 * 4),in_R8,in_R9);
                *(long *)(pdVar25 + -8) = sVar29.value._0_8_;
                *(long *)pdVar25 = sVar29.value._8_8_;
              }
              else {
                _Var16._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var11 = p_Stack_d0;
                  peVar10 = local_d8;
                  local_d8 = (element_type *)0x0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar10;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var11;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var16._M_head_impl =
                       (pTVar15->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar9 = (byte)uVar22 & 0x3f;
                _Var16._M_head_impl[uVar22 >> 6] =
                     _Var16._M_head_impl[uVar22 >> 6] &
                     (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              uVar22 = uVar22 + 1;
              pdVar25 = pdVar25 + 0x10;
            } while (count != uVar22);
          }
          if (local_c0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      paVar5 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar25 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar26 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          aVar28 = paVar5->pointer;
          pdVar26 = pdVar26 + 8;
          iVar19 = 0;
          do {
            sVar29 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)aVar28,
                                *(int *)(pdVar25 + iVar19 * 4),in_R8,in_R9);
            *(long *)(pdVar26 + -8) = sVar29.value._0_8_;
            *(long *)pdVar26 = sVar29.value._8_8_;
            iVar19 = iVar19 + 1;
            pdVar26 = pdVar26 + 0x10;
          } while (count != iVar19);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar20 = 0;
        uVar22 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar14 = uVar22 + 0x40;
            if (count <= uVar22 + 0x40) {
              uVar14 = count;
            }
LAB_01ac0823:
            uVar12 = uVar22;
            if (uVar22 < uVar14) {
              aVar28 = paVar5->pointer;
              pdVar27 = pdVar26 + uVar22 * 0x10 + 8;
              do {
                sVar29 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,(string_t)aVar28,
                                    *(int *)(pdVar25 + uVar22 * 4),in_R8,in_R9);
                *(long *)(pdVar27 + -8) = sVar29.value._0_8_;
                *(long *)pdVar27 = sVar29.value._8_8_;
                uVar22 = uVar22 + 1;
                pdVar27 = pdVar27 + 0x10;
                uVar12 = uVar14;
              } while (uVar14 != uVar22);
            }
          }
          else {
            uVar24 = puVar4[uVar20];
            uVar14 = uVar22 + 0x40;
            if (count <= uVar22 + 0x40) {
              uVar14 = count;
            }
            uVar12 = uVar14;
            if (uVar24 != 0) {
              if (uVar24 == 0xffffffffffffffff) goto LAB_01ac0823;
              uVar12 = uVar22;
              if (uVar22 < uVar14) {
                pdVar27 = pdVar26 + uVar22 * 0x10 + 8;
                uVar21 = 0;
                do {
                  if ((uVar24 >> (uVar21 & 0x3f) & 1) != 0) {
                    sVar29 = BinaryLambdaWrapper::
                             Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,(string_t)paVar5->pointer,
                                        *(int *)(pdVar25 + uVar21 * 4 + uVar22 * 4),in_R8,in_R9);
                    *(long *)(pdVar27 + -8) = sVar29.value._0_8_;
                    *(long *)pdVar27 = sVar29.value._8_8_;
                  }
                  uVar21 = uVar21 + 1;
                  pdVar27 = pdVar27 + 0x10;
                  uVar12 = uVar14;
                } while (uVar14 - uVar22 != uVar21);
              }
            }
          }
          uVar20 = uVar20 + 1;
          uVar22 = uVar12;
          if (uVar20 == count + 0x3f >> 6) {
            return;
          }
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitStringFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, int32_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t input, int32_t n) {
		    if (n < 0) {
			    throw InvalidInputException("The bitstring length cannot be negative");
		    }
		    idx_t input_length;
		    if (FROM_STRING) {
			    input_length = input.GetSize();
		    } else {
			    input_length = Bit::BitLength(input);
		    }
		    if (idx_t(n) < input_length) {
			    throw InvalidInputException("Length must be equal or larger than input string");
		    }
		    idx_t len;
		    if (FROM_STRING) {
			    Bit::TryGetBitStringSize(input, len, nullptr); // string verification
		    }

		    len = Bit::ComputeBitstringLen(UnsafeNumericCast<idx_t>(n));
		    string_t target = StringVector::EmptyString(result, len);
		    if (FROM_STRING) {
			    Bit::BitString(input, UnsafeNumericCast<idx_t>(n), target);
		    } else {
			    Bit::ExtendBitString(input, UnsafeNumericCast<idx_t>(n), target);
		    }
		    target.Finalize();
		    return target;
	    });
}